

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  ImDrawChannel *pIVar2;
  ImDrawList *in_RDI;
  ImDrawList *unaff_retaddr;
  int sz_1;
  int sz;
  ImDrawChannel *ch_1;
  int i_1;
  ImDrawCmd *cmd_write;
  ImDrawChannel *ch;
  int i;
  int new_idx_buffer_count;
  int new_cmd_buffer_count;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  ImDrawCmd *local_28;
  int local_14;
  int local_10;
  int local_c;
  
  if (1 < in_RDI->_ChannelsCount) {
    ChannelsSetCurrent(in_RDI,0);
    if (((in_RDI->CmdBuffer).Size != 0) &&
       (pIVar1 = ImVector<ImDrawCmd>::back(&in_RDI->CmdBuffer), pIVar1->ElemCount == 0)) {
      ImVector<ImDrawCmd>::pop_back(&in_RDI->CmdBuffer);
    }
    local_c = 0;
    local_10 = 0;
    for (local_14 = 1; local_14 < in_RDI->_ChannelsCount; local_14 = local_14 + 1) {
      pIVar2 = ImVector<ImDrawChannel>::operator[](&in_RDI->_Channels,local_14);
      if (((pIVar2->CmdBuffer).Size != 0) &&
         (pIVar1 = ImVector<ImDrawCmd>::back(&pIVar2->CmdBuffer), pIVar1->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back(&pIVar2->CmdBuffer);
      }
      local_c = (pIVar2->CmdBuffer).Size + local_c;
      local_10 = (pIVar2->IdxBuffer).Size + local_10;
    }
    ImVector<ImDrawCmd>::resize
              ((ImVector<ImDrawCmd> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_RDI >> 0x20));
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_RDI >> 0x20));
    local_28 = (in_RDI->CmdBuffer).Data + ((long)(in_RDI->CmdBuffer).Size - (long)local_c);
    in_RDI->_IdxWritePtr =
         (in_RDI->IdxBuffer).Data + ((long)(in_RDI->IdxBuffer).Size - (long)local_10);
    for (local_2c = 1; local_2c < in_RDI->_ChannelsCount; local_2c = local_2c + 1) {
      pIVar2 = ImVector<ImDrawChannel>::operator[](&in_RDI->_Channels,local_2c);
      iVar3 = (pIVar2->CmdBuffer).Size;
      if (iVar3 != 0) {
        memcpy(local_28,(pIVar2->CmdBuffer).Data,(long)iVar3 * 0x30);
        local_28 = local_28 + iVar3;
      }
      iVar3 = (pIVar2->IdxBuffer).Size;
      if (iVar3 != 0) {
        memcpy(in_RDI->_IdxWritePtr,(pIVar2->IdxBuffer).Data,(long)iVar3 << 1);
        in_RDI->_IdxWritePtr = in_RDI->_IdxWritePtr + iVar3;
      }
    }
    UpdateClipRect(unaff_retaddr);
    in_RDI->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}